

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_kernel_c.h
# Opt level: O3

range * __thiscall
dlib::
map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
::operator[](map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
             *this,domain *d)

{
  ulong uVar1;
  ostream *poVar2;
  fatal_error *this_00;
  long *plVar3;
  long *plVar4;
  ostringstream dlib_o_out;
  string local_1b0;
  undefined1 local_190 [376];
  
  plVar3 = *(long **)(this + 0x40);
  if (plVar3 != (long *)0x0) {
    uVar1 = *d;
    plVar4 = plVar3;
    do {
      if ((ulong)plVar4[2] <= uVar1) {
        if (uVar1 <= (ulong)plVar4[2]) {
          do {
            if ((ulong)plVar3[2] <= uVar1) {
              if (uVar1 <= (ulong)plVar3[2]) {
                return (range *)(plVar3 + 3);
              }
              plVar3 = plVar3 + 1;
            }
            plVar3 = (long *)*plVar3;
          } while( true );
        }
        plVar4 = plVar4 + 1;
      }
      plVar4 = (long *)*plVar4;
    } while (plVar4 != (long *)0x0);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\n\nError detected at line ",0x19);
  poVar2 = (ostream *)std::ostream::operator<<(local_190,0xd8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/bsp/../sockets/../threads/../map/map_kernel_c.h"
             ,0x7c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "typename map_base::range_type &dlib::map_kernel_c<dlib::map_kernel_1<unsigned long, std::unique_ptr<dlib::impl1::bsp_con>, dlib::binary_search_tree_kernel_1<unsigned long, std::unique_ptr<dlib::impl1::bsp_con>, dlib::memory_manager_stateless_kernel_1<char>>>>::operator[](const domain &) [map_base = dlib::map_kernel_1<unsigned long, std::unique_ptr<dlib::impl1::bsp_con>, dlib::binary_search_tree_kernel_1<unsigned long, std::unique_ptr<dlib::impl1::bsp_con>, dlib::memory_manager_stateless_kernel_1<char>>>]"
             ,0x1fd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"this->is_in_domain(d)",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
  *(uint *)(*(_func_int **)(local_190._0_8_ + -0x18) + (long)(local_190 + 0x18)) =
       *(uint *)(*(_func_int **)(local_190._0_8_ + -0x18) + (long)(local_190 + 0x18)) | 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\trange& map::operator[]",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\n\td must be in the domain of the map",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n\tthis: ",8);
  poVar2 = std::ostream::_M_insert<void_const*>(local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  this_00 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this_00,EBROKEN_ASSERT,&local_1b0);
  __cxa_throw(this_00,&fatal_error::typeinfo,error::~error);
}

Assistant:

typename map_base::range_type& map_kernel_c<map_base>::
    operator[] (
        const domain& d
    )
    {
        // make sure requires clause is not broken
        DLIB_CASSERT( this->is_in_domain(d),
            "\trange& map::operator[]"
            << "\n\td must be in the domain of the map"
            << "\n\tthis: " << this
            );

        // call the real function
        return map_base::operator[](d);
    }